

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal_ports.cpp
# Opt level: O0

int __thiscall sc_core::sc_in<bool>::vbind(sc_in<bool> *this,sc_port_base *parent_)

{
  socklen_t in_ECX;
  sockaddr *in_RDX;
  long in_RSI;
  sc_port_base *in_RDI;
  undefined1 auVar1 [16];
  inout_port_type *inout_parent;
  in_port_type *in_parent;
  long local_50;
  long local_40;
  int local_4;
  
  if (in_RSI == 0) {
    local_40 = 0;
  }
  else {
    in_ECX = 0;
    auVar1 = __dynamic_cast(in_RSI,&sc_port_base::typeinfo,
                            &sc_port<sc_core::sc_signal_in_if<bool>,1,(sc_core::sc_port_policy)0>::
                             typeinfo);
    in_RDX = auVar1._8_8_;
    local_40 = auVar1._0_8_;
  }
  if (local_40 == 0) {
    if (in_RSI == 0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = in_RDX;
      auVar1 = auVar1 << 0x40;
    }
    else {
      in_ECX = 0;
      auVar1 = __dynamic_cast(in_RSI,&sc_port_base::typeinfo,
                              &sc_port<sc_core::sc_signal_inout_if<bool>,1,(sc_core::sc_port_policy)0>
                               ::typeinfo);
    }
    local_50 = auVar1._0_8_;
    if (local_50 == 0) {
      local_4 = 2;
    }
    else {
      sc_port_base::bind(in_RDI,auVar1._0_4_,auVar1._8_8_,in_ECX);
      local_4 = 0;
    }
  }
  else {
    sc_port_base::bind(in_RDI,(int)local_40,in_RDX,in_ECX);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
sc_in<bool>::vbind( sc_port_base& parent_ )
{
    in_port_type* in_parent = dynamic_cast<in_port_type*>( &parent_ );
    if( in_parent != 0 ) {
	sc_port_base::bind( *in_parent );
	return 0;
    }
    inout_port_type* inout_parent = dynamic_cast<inout_port_type*>( &parent_ );
    if( inout_parent != 0 ) {
	sc_port_base::bind( *inout_parent );
	return 0;
    }
    // type mismatch
    return 2;
}